

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

double __thiscall
math::wide_integer::uintwide_t<256u,unsigned_int,void,true>::
extract_builtin_floating_point_type<double,void>(uintwide_t<256u,unsigned_int,void,true> *this)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  size_t i;
  uint uVar6;
  int iVar7;
  unsigned_fast_type uVar8;
  value_type_conflict *x;
  int iVar9;
  limb_type lm_mask;
  uint uVar10;
  bool bVar11;
  uintwide_t<256U,_unsigned_int,_void,_true> tmp;
  local_unsigned_wide_integer_type u;
  
  iVar1 = *(int *)(this + 0x1c);
  tmp.values.super_array<unsigned_int,_8UL>.elems._0_8_ = *(undefined8 *)this;
  tmp.values.super_array<unsigned_int,_8UL>.elems._8_8_ = *(undefined8 *)(this + 8);
  tmp.values.super_array<unsigned_int,_8UL>.elems._16_8_ = *(undefined8 *)(this + 0x10);
  tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_ = *(undefined8 *)(this + 0x18);
  if (iVar1 < 0) {
    uintwide_t<256U,_unsigned_int,_void,_true>::negate(&tmp);
  }
  x = (value_type_conflict *)&u;
  u.values.super_array<unsigned_int,_8UL>.elems[4] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[4];
  u.values.super_array<unsigned_int,_8UL>.elems[5] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[5];
  u.values.super_array<unsigned_int,_8UL>.elems[6] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[6];
  u.values.super_array<unsigned_int,_8UL>.elems[7] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[7];
  u.values.super_array<unsigned_int,_8UL>.elems[0] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[0];
  u.values.super_array<unsigned_int,_8UL>.elems[1] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[1];
  u.values.super_array<unsigned_int,_8UL>.elems[2] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[2];
  u.values.super_array<unsigned_int,_8UL>.elems[3] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[3];
  uVar8 = msb<256u,unsigned_int,void,false>((uintwide_t<256U,_unsigned_int,_void,_false> *)x);
  uVar6 = (int)uVar8 + 1;
  dVar2 = 0.0;
  dVar4 = 1.0;
  for (iVar7 = 0; iVar7 != ((uVar6 >> 5) + 1) - (uint)((uVar6 & 0x1f) == 0); iVar7 = iVar7 + 1) {
    iVar9 = 0x20;
    uVar10 = 1;
    dVar3 = 0.0;
    while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
      dVar5 = dVar3 + dVar4;
      if ((*x & uVar10) == 0) {
        dVar5 = dVar3;
      }
      dVar3 = dVar5;
      uVar10 = uVar10 * 2;
      dVar4 = dVar4 + dVar4;
    }
    dVar2 = dVar2 + dVar3;
    x = x + 1;
  }
  if (iVar1 < 0) {
    dVar2 = -dVar2;
  }
  return dVar2;
}

Assistant:

static constexpr auto is_neg(const uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>& a, // NOLINT(hicpp-named-parameter,readability-named-parameter)
                                 std::enable_if_t<RePhraseIsSigned, int>* = nullptr) -> bool             // NOLINT(hicpp-named-parameter,readability-named-parameter)
    {
      return (static_cast<std::uint_fast8_t>(static_cast<std::uint_fast8_t>(a.values.back() >> static_cast<size_t>(std::numeric_limits<typename uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>::limb_type>::digits - 1)) & 1U) != 0U);
    }